

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.h
# Opt level: O0

long Assimp::FBX::PropertyGet<long>(PropertyTable *in,string *name,long *defaultValue)

{
  Property *this;
  TypedProperty<long> *this_00;
  long *plVar1;
  TypedProperty<long> *tprop;
  Property *prop;
  long *defaultValue_local;
  string *name_local;
  PropertyTable *in_local;
  
  this = PropertyTable::Get(in,name);
  if (this == (Property *)0x0) {
    in_local = (PropertyTable *)*defaultValue;
  }
  else {
    this_00 = Property::As<Assimp::FBX::TypedProperty<long>>(this);
    if (this_00 == (TypedProperty<long> *)0x0) {
      in_local = (PropertyTable *)*defaultValue;
    }
    else {
      plVar1 = TypedProperty<long>::Value(this_00);
      in_local = (PropertyTable *)*plVar1;
    }
  }
  return (long)in_local;
}

Assistant:

inline 
T PropertyGet(const PropertyTable& in, const std::string& name, const T& defaultValue) {
    const Property* const prop = in.Get(name);
    if( nullptr == prop) {
        return defaultValue;
    }

    // strong typing, no need to be lenient
    const TypedProperty<T>* const tprop = prop->As< TypedProperty<T> >();
    if( nullptr == tprop) {
        return defaultValue;
    }

    return tprop->Value();
}